

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

bool_t prf_group_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  int8_t iVar1;
  uint16_t uVar2;
  int16_t iVar3;
  uint32_t uVar4;
  int iVar5;
  int32_t iVar6;
  void *pvVar7;
  bfile_t *in_RDX;
  long *in_RSI;
  ushort *in_RDI;
  bfile_t *unaff_retaddr;
  node_data_conflict2 *data;
  int pos;
  bfile_t *in_stack_ffffffffffffffc8;
  bfile_t *in_stack_ffffffffffffffd0;
  bfile_t *bfile_00;
  uint in_stack_ffffffffffffffdc;
  int iVar8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  bool_t bVar9;
  
  uVar2 = bf_get_uint16_be(in_stack_ffffffffffffffd0);
  *in_RDI = uVar2;
  if (*in_RDI == prf_group_info.opcode) {
    uVar2 = bf_get_uint16_be(in_stack_ffffffffffffffd0);
    in_RDI[1] = uVar2;
    if (in_RDI[1] < 0x1c) {
      prf_error(3,"no support for so short (%d bytes) group nodes.",(ulong)in_RDI[1]);
      bf_rewind(in_RDX,in_stack_ffffffffffffffdc);
      bVar9 = 0;
    }
    else {
      if ((4 < in_RDI[1]) && (*(long *)(in_RDI + 4) == 0)) {
        if (*(short *)(*in_RSI + 8) == 0) {
          pvVar7 = malloc((long)(int)(in_RDI[1] - 4));
          *(void **)(in_RDI + 4) = pvVar7;
        }
        else {
          pvVar7 = pool_malloc((pool_t)((ulong)in_RSI >> 0x30),(int)in_RSI);
          *(void **)(in_RDI + 4) = pvVar7;
        }
        if (*(long *)(in_RDI + 4) == 0) {
          prf_error(9,"memory allocation problem (returned NULL)");
          bf_rewind(in_RDX,in_stack_ffffffffffffffdc);
          return 0;
        }
      }
      iVar8 = 4;
      bfile_00 = *(bfile_t **)(in_RDI + 4);
      bf_read(unaff_retaddr,(uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
              ,(uint)((ulong)in_RDI >> 0x20));
      iVar8 = iVar8 + 8;
      iVar3 = bf_get_int16_be(bfile_00);
      *(int16_t *)&bfile_00->file = iVar3;
      iVar8 = iVar8 + 2;
      iVar3 = bf_get_int16_be(bfile_00);
      *(int16_t *)((long)&bfile_00->file + 2) = iVar3;
      iVar8 = iVar8 + 2;
      uVar4 = bf_get_uint32_be(bfile_00);
      *(uint32_t *)((long)&bfile_00->file + 4) = uVar4;
      iVar8 = iVar8 + 4;
      iVar3 = bf_get_int16_be(bfile_00);
      *(int16_t *)&bfile_00->size = iVar3;
      iVar8 = iVar8 + 2;
      iVar3 = bf_get_int16_be(bfile_00);
      *(int16_t *)((long)&bfile_00->size + 2) = iVar3;
      iVar8 = iVar8 + 2;
      iVar3 = bf_get_int16_be(bfile_00);
      *(int16_t *)((long)&bfile_00->size + 4) = iVar3;
      iVar8 = iVar8 + 2;
      iVar1 = bf_get_int8(in_stack_ffffffffffffffc8);
      *(int8_t *)((long)&bfile_00->size + 6) = iVar1;
      iVar8 = iVar8 + 1;
      iVar1 = bf_get_int8(in_stack_ffffffffffffffc8);
      *(int8_t *)((long)&bfile_00->size + 7) = iVar1;
      iVar5 = iVar8 + 1;
      if (iVar8 + 5 <= (int)(uint)in_RDI[1]) {
        iVar6 = bf_get_int32_be(bfile_00);
        *(int32_t *)&bfile_00->pos = iVar6;
        iVar5 = iVar5 + 4;
      }
      if (iVar5 < (int)(uint)in_RDI[1]) {
        bf_read(unaff_retaddr,
                (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                (uint)((ulong)in_RDI >> 0x20));
      }
      bVar9 = 1;
    }
  }
  else {
    prf_error(9,"tried group load method for node of type %d.",(ulong)*in_RDI);
    bf_rewind(in_RDX,in_stack_ffffffffffffffdc);
    bVar9 = 0;
  }
  return bVar9;
}

Assistant:

static
bool_t
prf_group_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_group_info.opcode ) {
        prf_error( 9, "tried group load method for node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );
    if ( node->length < 28 ) {
        prf_error( 3, "no support for so short (%d bytes) group nodes.",
            node->length );
        bf_rewind( bfile, 4 );
        return FALSE;
    }

    if ( node->length > 4 && node->data == NULL ) {
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
             node->data = (uint8_t *)malloc( node->length-4+NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;

        bf_read( bfile, (uint8_t *) data->ascii_id, 8 ); pos += 8;
        data->relative_priority = bf_get_int16_be( bfile ); pos += 2;
        data->reserved1 = bf_get_int16_be( bfile ); pos += 2;
        data->flags = bf_get_uint32_be( bfile ); pos += 4;
        data->special_effect_id1 = bf_get_int16_be( bfile ); pos += 2;
        data->special_effect_id2 = bf_get_int16_be( bfile ); pos += 2;
        data->significance = bf_get_int16_be( bfile ); pos += 2;
        data->layer_code = bf_get_int8( bfile ); pos += 1;
        data->reserved2 = bf_get_int8( bfile ); pos += 1;
        if ( node->length < (pos + 4) ) break;
        data->reserved3 = bf_get_int32_be( bfile ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}